

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall exe_reconstructor::printexe(exe_reconstructor *this)

{
  element_type *this_00;
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  __shared_ptr_access<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *this_02;
  const_reference pvVar4;
  shared_ptr<exe_reconstructor::sectioninfo> local_28;
  uint local_14;
  exe_reconstructor *peStack_10;
  uint i;
  exe_reconstructor *this_local;
  
  peStack_10 = this;
  this_00 = std::
            __shared_ptr_access<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<exe_reconstructor::e32rom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  e32rom::printe32(this_00);
  sVar1 = std::
          vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
          ::size(&this->_sections);
  sVar2 = std::
          vector<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
          ::size(&this->_o32rom);
  if (sVar1 != sVar2) {
    sVar1 = std::
            vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ::size(&this->_sections);
    sVar2 = std::
            vector<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
            ::size(&this->_o32rom);
    printf("WARNING: #sections=%d, #o32=%d\n",sVar1 & 0xffffffff,sVar2 & 0xffffffff);
  }
  for (local_14 = 0; uVar3 = (ulong)local_14,
      sVar1 = std::
              vector<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
              ::size(&this->_o32rom), uVar3 < sVar1; local_14 = local_14 + 1) {
    this_01 = (__shared_ptr_access<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 vector<std::shared_ptr<exe_reconstructor::o32rom>,_std::allocator<std::shared_ptr<exe_reconstructor::o32rom>_>_>
                 ::operator[](&this->_o32rom,(ulong)local_14);
    this_02 = std::
              __shared_ptr_access<exe_reconstructor::o32rom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_01);
    uVar3 = (ulong)local_14;
    sVar1 = std::
            vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
            ::size(&this->_sections);
    if (sVar1 <= uVar3) {
      std::shared_ptr<exe_reconstructor::sectioninfo>::shared_ptr(&local_28);
    }
    else {
      pvVar4 = std::
               vector<std::shared_ptr<exe_reconstructor::sectioninfo>,_std::allocator<std::shared_ptr<exe_reconstructor::sectioninfo>_>_>
               ::operator[](&this->_sections,(ulong)local_14);
      std::shared_ptr<exe_reconstructor::sectioninfo>::shared_ptr(&local_28,pvVar4);
    }
    o32rom::printo32(this_02,&local_28);
    if (sVar1 <= uVar3) {
      std::shared_ptr<exe_reconstructor::sectioninfo>::~shared_ptr(&local_28);
    }
    else {
      std::shared_ptr<exe_reconstructor::sectioninfo>::~shared_ptr(&local_28);
    }
  }
  return;
}

Assistant:

void printexe() const
    {
        _e32rom->printe32();
        if (_sections.size() != _o32rom.size())
            printf("WARNING: #sections=%d, #o32=%d\n", (int)_sections.size(), (int)_o32rom.size());
        for (unsigned i= 0 ; i<_o32rom.size() ; i++) 
            _o32rom[i]->printo32(i<_sections.size() ? _sections[i] : sectioninfo_ptr());
    }